

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O1

MPP_RET vdpu383_av1d_gen_regs(void *hal,HalTaskInfo *task)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  byte *pbVar7;
  HalBufs bufs;
  void *pvVar8;
  long *plVar9;
  void *pvVar10;
  undefined8 *puVar11;
  RK_U32 RVar12;
  int iVar13;
  RK_U32 RVar14;
  MppFrameFormat MVar15;
  RK_S32 RVar16;
  int iVar17;
  long lVar18;
  size_t sVar19;
  undefined8 *puVar20;
  uint *puVar21;
  HalBuf *pHVar22;
  ulong uVar23;
  MppBuffer *ppvVar24;
  long lVar25;
  uint uVar26;
  char *fmt;
  DXVA_PicParams_AV1 *pic_param;
  uint uVar27;
  RK_U64 RVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  MppBuffer buffer;
  uint uVar32;
  uint uVar33;
  HalBufs *ppvVar34;
  byte *pbVar35;
  int *piVar36;
  long *plVar37;
  HalTaskInfo *pHVar38;
  bool bVar39;
  MppFrame mframe;
  size_t origin_buf_size;
  RK_U32 mapped_frame_width [8];
  MppBuffer mbuffer;
  MppFrame local_198;
  BitputCtx_t local_190;
  void *local_170;
  void *local_168;
  undefined8 *local_160;
  HalTaskInfo *local_158;
  uint *local_150;
  uint *local_148;
  byte *local_140;
  uint *local_138;
  uint *local_130;
  uint *local_128;
  uint *local_120;
  uint *local_118;
  uint *local_110;
  uint *local_108;
  uint *local_100;
  uint *local_f8;
  uint *local_f0;
  uint *local_e8;
  uint *local_e0;
  void *local_d8;
  Vdpu383CtrlReg *local_d0;
  MppBuffer local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint *local_a8;
  uint *local_a0;
  uint *local_98;
  uint *local_90;
  uint *local_88;
  uint *local_80;
  uint *local_78;
  uint *local_70;
  uint *local_68;
  MppBuffer local_60;
  uint local_58 [10];
  
  if (hal == (void *)0x0) {
    if (((byte)hal_av1d_debug & 4) == 0) {
      return MPP_OK;
    }
    _mpp_log_l(4,"hal_av1d_vdpu383","input empty(%d).\n",(char *)0x0,0x88a);
    return MPP_OK;
  }
  puVar20 = *(undefined8 **)((long)hal + 0x50);
  pbVar7 = (byte *)(task->dec).syntax.data;
  *(uint *)((long)puVar20 + 0x1b684) = (uint)pbVar7[0xc86];
  uVar23 = *(ulong *)((long)task + 8);
  if ((uVar23 & 0xc) != 0) {
    _mpp_log_l(2,"hal_av1d_vdpu383","parse err %d ref err %d\n","vdpu383_av1d_gen_regs",
               (ulong)((uint)(uVar23 >> 2) & 1),(ulong)((uint)uVar23 >> 3 & 1));
    return MPP_OK;
  }
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x20),*pbVar7 & 0x7f,SLOT_FRAME_PTR,&local_198)
  ;
  RVar12 = mpp_frame_get_thumbnail_en(local_198);
  if (RVar12 == 2) {
    uVar26 = *(uint *)(pbVar7 + 4);
    if ((ushort)*(uint *)(pbVar7 + 4) < *(ushort *)(pbVar7 + 2)) {
      uVar26 = (uint)*(ushort *)(pbVar7 + 2);
    }
    if ((0x1000 < (uVar26 & 0xffff)) && (puVar20[0x3d8d] == 0)) {
      lVar18 = *(long *)((long)hal + 0x50);
      local_190._0_8_ = (MppBuffer)0x0;
      local_190._0_8_ = mpp_frame_get_buf_size(local_198);
      if ((MppBuffer)local_190._0_8_ == (MppBuffer)0x0) {
        fmt = "origin_bufs get buf size failed\n";
      }
      else {
        bufs = *(HalBufs *)(lVar18 + 0x1ec68);
        ppvVar34 = (HalBufs *)(lVar18 + 0x1ec68);
        if (bufs != (HalBufs)0x0) {
          hal_bufs_deinit(bufs);
          *ppvVar34 = (HalBufs)0x0;
        }
        hal_bufs_init(ppvVar34);
        if (*ppvVar34 != (HalBufs)0x0) {
          hal_bufs_setup(*ppvVar34,0x10,1,(size_t *)&local_190);
          goto LAB_00215de4;
        }
        fmt = "origin_bufs init fail\n";
      }
      _mpp_log_l(2,"hal_av1d_vdpu383",fmt,"vdpu383_setup_scale_origin_bufs");
    }
  }
LAB_00215de4:
  if (*(int *)((long)hal + 0x58) != 0) {
    lVar18 = 0x10;
    lVar25 = 0;
    do {
      if (*(int *)((long)puVar20 + lVar18) == 0) {
        (task->dec).reg_index = (RK_S32)lVar25;
        *puVar20 = *(undefined8 *)((long)puVar20 + lVar18 + 8);
        *(undefined4 *)((long)puVar20 + lVar18) = 1;
        *(undefined4 *)(puVar20 + 1) = *(undefined4 *)((long)puVar20 + lVar25 * 4 + 0x58);
        break;
      }
      lVar25 = lVar25 + 1;
      lVar18 = lVar18 + 0x10;
    } while (lVar25 != 3);
  }
  pvVar8 = (void *)*puVar20;
  memset(pvVar8,0,0x298);
  local_158 = task;
  sVar19 = mpp_packet_get_length((task->dec).input_packet);
  *(int *)((long)hal + 0x10) = (int)sVar19;
  *(undefined4 *)((long)pvVar8 + 4) = 4;
  *(byte *)((long)pvVar8 + 8) = *(byte *)((long)pvVar8 + 8) & 0xee;
  *(uint *)((long)pvVar8 + 0xc) = *(uint *)((long)pvVar8 + 0xc) | 0x3ff;
  *(undefined4 *)((long)pvVar8 + 0x18) = 0x3fffff;
  *(uint *)((long)pvVar8 + 0x24) = (*(uint *)((long)pvVar8 + 0x24) & 0xfefffefe) + 1;
  *(undefined8 *)((long)pvVar8 + 0x34) = 0x3fffffffffffffdf;
  *(uint *)((long)pvVar8 + 0x54) = *(uint *)((long)pvVar8 + 0x54) & 0xfffff006 | 0xb9;
  *(uint *)((long)pvVar8 + 0x58) = *(uint *)((long)pvVar8 + 0x58) & 0xfe00f000 | 0x119;
  *(uint *)((long)pvVar8 + 0x5c) = *(uint *)((long)pvVar8 + 0x5c) & 0xf0fff0ff;
  local_60 = (MppBuffer)0x0;
  local_170 = hal;
  local_168 = pvVar8;
  mpp_set_bitput_ctx(&local_190,(RK_U64 *)((long)puVar20 + 0x1e9d4),0x52);
  mpp_put_bits(&local_190,(ulong)((uint)*(undefined8 *)(pbVar7 + 0x14) & 0xfff),0xc);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0xc & 1),1);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0x1c & 1),1);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0xd & 1),1);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0xe & 1),1);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0xf & 1),1);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0x11 & 1),1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x52f],1);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0x12 & 1),1);
  mpp_put_bits(&local_190,(ulong)((uint)((ulong)*(undefined8 *)(pbVar7 + 0x14) >> 0x27) & 1),1);
  uVar23 = (ulong)(pbVar7[0x531] - 1);
  if (pbVar7[0x531] == 0) {
    uVar23 = 0;
  }
  mpp_put_bits(&local_190,uVar23,3);
  bVar39 = true;
  if (pbVar7[0x55a] == 0) {
    bVar39 = pbVar7[0x55b] != 0;
  }
  RVar28 = 1;
  if (pbVar7[0x56a] == 0) {
    RVar28 = (RK_U64)(pbVar7[0x56b] != 0);
  }
  if (pbVar7[0xc5c] == 0) {
    if (bVar39) {
      RVar28 = 1;
    }
    if (pbVar7[0x559] != 0) {
      RVar28 = 1;
    }
  }
  else {
    RVar28 = 0;
  }
  local_160 = puVar20;
  mpp_put_bits(&local_190,RVar28,1);
  RVar28 = 0;
  uVar23 = (ulong)(*(ushort *)(pbVar7 + 0xe) - 8);
  if (*(ushort *)(pbVar7 + 0xe) < 9) {
    uVar23 = RVar28;
  }
  mpp_put_bits(&local_190,uVar23,3);
  if ((pbVar7[0x52d] == 0) && (RVar28 = 1, pbVar7[0x52c] != 1)) {
    RVar28 = (ulong)(pbVar7[0x52b] == 1) ^ 3;
  }
  local_d0 = (Vdpu383CtrlReg *)((long)local_168 + 4);
  mpp_put_bits(&local_190,RVar28,2);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x694],8);
  mpp_put_bits(&local_190,(ulong)(pbVar7[0x17] & 1),1);
  bVar39 = (pbVar7[0x528] & 0xfd) == 0;
  mpp_put_bits(&local_190,(ulong)bVar39,1);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0x1e & 1),1);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0x13 & 1),1);
  mpp_put_bits(&local_190,(ulong)(bVar39 || (*(uint *)(pbVar7 + 0x14) & 0x300000) != 0),1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x530],8);
  mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + 2),0x10);
  mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + 4),0x10);
  mpp_put_bits(&local_190,(ulong)((uint)((ulong)*(undefined8 *)(pbVar7 + 0x14) >> 0x22) & 1),1);
  mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + 0xc),5);
  mpp_put_bits(&local_190,(ulong)*(uint *)(pbVar7 + 0xc70),0x10);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0x1a & 1),1);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0x19 & 1),1);
  lVar18 = 0x1ce;
  do {
    RVar28 = 0xffffffff;
    if (*(int *)(pbVar7 + 0x734) != 0) {
      RVar28 = (RK_U64)*(uint *)(pbVar7 + lVar18 * 4);
    }
    mpp_put_bits(&local_190,RVar28,3);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x1d5);
  mpp_put_bits(&local_190,(ulong)pbVar7[0xc64],3);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0x1b & 1),1);
  mpp_put_bits(&local_190,(ulong)((uint)((ulong)*(undefined8 *)(pbVar7 + 0x14) >> 0x26) & 1),1);
  local_140 = pbVar7 + 0x774;
  lVar18 = 0x77c;
  do {
    mpp_put_bits(&local_190,(ulong)*(uint *)(pbVar7 + lVar18),8);
    lVar18 = lVar18 + 0x6c;
  } while (lVar18 != 0xadc);
  lVar18 = 0x1ce;
  do {
    mpp_put_bits(&local_190,
                 (ulong)*(uint *)(pbVar7 + (ulong)*(uint *)(pbVar7 + lVar18 * 4) * 4 + 0x754),8);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x1d5);
  lVar25 = 0xc54;
  lVar18 = 0x1e9;
  do {
    if (pbVar7[0x531] == 0) {
      bVar39 = false;
LAB_0021631d:
      pbVar7[lVar25] = bVar39;
    }
    else if (-1 < (char)pbVar7[lVar18 * 4]) {
      uVar26 = 1 << (pbVar7[0x531] - 1 & 0x1f);
      bVar39 = (int)(uVar26 & *(int *)(local_140 +
                                      (ulong)*(uint *)(pbVar7 + lVar25 * 4 + -0x2a18) * 0x6c + 8) -
                              (uint)pbVar7[0x530]) <
               (int)(uVar26 - 1 &
                    *(int *)(local_140 + (ulong)*(uint *)(pbVar7 + lVar25 * 4 + -0x2a18) * 0x6c + 8)
                    - (uint)pbVar7[0x530]);
      goto LAB_0021631d;
    }
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar25],1);
    lVar25 = lVar25 + 1;
    lVar18 = lVar18 + 0x1b;
  } while (lVar25 != 0xc5b);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0x1d & 1),1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x54e],8);
  mpp_put_bits(&local_190,(long)(char)pbVar7[0x54f],7);
  mpp_put_bits(&local_190,(long)(char)pbVar7[0x550],7);
  mpp_put_bits(&local_190,(long)(char)pbVar7[0x552],7);
  mpp_put_bits(&local_190,(long)(char)pbVar7[0x551],7);
  mpp_put_bits(&local_190,(long)(char)pbVar7[0x553],7);
  mpp_put_bits(&local_190,(long)(char)pbVar7[0x554],1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x57c],1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x57d],1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x57f],1);
  if (pbVar7[0x57c] == 0) {
    RVar28 = 0;
  }
  else {
    RVar28 = 0;
    if ((pbVar7[0x52e] != 0) &&
       ((*(ushort *)(pbVar7 + 2) + 7 >> 2 & 0xfffffffe) ==
        (*(int *)(pbVar7 + 0x774) + 7U >> 2 & 0xfffffffe))) {
      RVar28 = (RK_U64)((*(ushort *)(pbVar7 + 4) + 7 >> 2 & 0xfffffffe) ==
                       (*(int *)(pbVar7 + 0x778) + 7U >> 2 & 0xfffffffe));
    }
  }
  mpp_put_bits(&local_190,RVar28,1);
  lVar18 = 0x580;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],8);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x588);
  pbVar35 = pbVar7 + 0x588;
  lVar18 = 0x59c;
  do {
    mpp_put_bits(&local_190,(long)*(int *)(pbVar7 + lVar18 + -0x14),9);
    mpp_put_bits(&local_190,(long)*(int *)(pbVar7 + lVar18 + -0x10),7);
    mpp_put_bits(&local_190,(long)*(int *)(pbVar7 + lVar18 + -0xc),7);
    mpp_put_bits(&local_190,(long)*(int *)(pbVar7 + lVar18 + -8),7);
    mpp_put_bits(&local_190,(long)*(int *)(pbVar7 + lVar18 + -4),7);
    mpp_put_bits(&local_190,(long)*(int *)(pbVar7 + lVar18),3);
    lVar18 = lVar18 + 0x20;
  } while (lVar18 != 0x69c);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x688],3);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x689],1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x54c],1);
  RVar28 = (long)(1 << (pbVar7[0x54d] & 0x1f));
  if (pbVar7[0x54c] != 0) {
    RVar28 = (ulong)pbVar7[0x54d];
  }
  mpp_put_bits(&local_190,RVar28,2);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x53a],1);
  mpp_put_bits(&local_190,(long)(1 << (pbVar7[0x53b] & 0x1f)),2);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x539],1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0xc5c],1);
  lVar18 = 0x580;
  do {
    uVar26 = (uint)pbVar7[0x54e];
    if ((pbVar7[lVar18] & 1) != 0) {
      uVar26 = (uint)pbVar7[0x54e] + *(int *)pbVar35;
    }
    if (((((int)uVar26 < 1) && (pbVar7[0x54f] == 0)) && (pbVar7[0x550] == 0)) &&
       ((pbVar7[0x551] == 0 && (pbVar7[0x552] == 0)))) {
      RVar28 = (RK_U64)(pbVar7[0x553] == 0);
    }
    else {
      RVar28 = 0;
    }
    mpp_put_bits(&local_190,RVar28,1);
    lVar18 = lVar18 + 1;
    pbVar35 = pbVar35 + 0x20;
  } while (lVar18 != 0x588);
  mpp_put_bits(&local_190,(long)*(int *)(pbVar7 + 0xc60),1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x555],4);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x556],4);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x557],4);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x532],6);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x533],6);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x534],6);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x535],6);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x536],3);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x537],1);
  lVar18 = 0x53c;
  do {
    mpp_put_bits(&local_190,(long)(char)pbVar7[lVar18],7);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x544);
  lVar18 = 0x544;
  do {
    mpp_put_bits(&local_190,(long)(char)pbVar7[lVar18],7);
    lVar18 = lVar18 + 1;
  } while (lVar18 == 0x545);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x558] + 3,3);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x559],2);
  lVar18 = 0x2ad;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18 * 2],4);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x2b5);
  lVar18 = 0x2b5;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18 * 2],4);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x2bd);
  lVar18 = 0x55b;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],2);
    lVar18 = lVar18 + 2;
  } while (lVar18 != 0x56b);
  lVar18 = 0x56b;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],2);
    lVar18 = lVar18 + 2;
  } while (lVar18 != 0x57b);
  uVar26 = 0;
  uVar23 = 0;
  do {
    uVar26 = pbVar7[uVar23 + 0x546] != 0 | uVar26;
    if (pbVar7[0x52d] != 0) break;
    bVar39 = uVar23 < 2;
    uVar23 = uVar23 + 1;
  } while (bVar39);
  mpp_put_bits(&local_190,(ulong)uVar26,1);
  lVar18 = 0x546;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],2);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x549);
  lVar18 = 0x549;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],2);
    lVar18 = lVar18 + 1;
  } while (lVar18 == 0x54a);
  mpp_put_bits(&local_190,(ulong)((uint)((ulong)*(undefined8 *)(pbVar7 + 0x14) >> 0x23) & 7),2);
  mpp_put_bits(&local_190,(ulong)(*(uint *)(pbVar7 + 0x14) >> 0x1f),1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0xc84],3);
  mpp_put_bits(&local_190,(ulong)pbVar7[0xc85],3);
  mpp_put_bits(&local_190,(ulong)((uint)((ulong)*(undefined8 *)(pbVar7 + 0x14) >> 0x20) & 1),1);
  mpp_put_bits(&local_190,(ulong)(*(ushort *)(pbVar7 + 0x16) & 1),1);
  mpp_put_bits(&local_190,(ulong)((uint)((ulong)*(undefined8 *)(pbVar7 + 0x14) >> 0x21) & 1),1);
  lVar18 = 0x7a6;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],2);
    lVar18 = lVar18 + 0x6c;
  } while (lVar18 != 0xa9a);
  pbVar35 = pbVar7 + 0x7c0;
  lVar18 = 0;
  do {
    lVar25 = 0;
    do {
      mpp_put_bits(&local_190,(long)*(int *)(pbVar35 + lVar25 * 4),0x11);
      lVar25 = lVar25 + 1;
    } while (lVar25 != 6);
    lVar18 = lVar18 + 1;
    pbVar35 = pbVar35 + 0x6c;
  } while (lVar18 != 7);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x68c],1);
  mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + 0x72c),0x10);
  mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + 0x72e),1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x696],4);
  lVar18 = 0x699;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],8);
    lVar18 = lVar18 + 2;
  } while (lVar18 != 0x6b5);
  lVar18 = 0x34d;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18 * 2],8);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x35b);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x68e],1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x697],4);
  lVar18 = 0x6b5;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],8);
    lVar18 = lVar18 + 2;
  } while (lVar18 != 0x6c9);
  lVar18 = 0x35b;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18 * 2],8);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x365);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x698],4);
  lVar18 = 0x6c9;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],8);
    lVar18 = lVar18 + 2;
  } while (lVar18 != 0x6dd);
  lVar18 = 0x365;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18 * 2],8);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x36f);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x68d],2);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x68f],2);
  lVar18 = 0x6dd;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],8);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x6f5);
  lVar18 = 0x6f5;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],8);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x70e);
  lVar18 = 0x70e;
  do {
    mpp_put_bits(&local_190,(ulong)pbVar7[lVar18],8);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x727);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x690],2);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x691],2);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x727],8);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x728],8);
  mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + 0x730),9);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x729],8);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x72a],8);
  mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + 0x732),9);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x692],1);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x693],1);
  lVar18 = 0xadc;
  do {
    mpp_put_bits(&local_190,(long)*(int *)(pbVar7 + lVar18),0x10);
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0xc5c);
  lVar18 = 0xae4;
  do {
    mpp_put_bits(&local_190,(long)*(int *)(pbVar7 + lVar18),0x10);
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0xc64);
  lVar18 = 0xae0;
  do {
    mpp_put_bits(&local_190,(long)*(int *)(pbVar7 + lVar18),0x10);
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0xc60);
  lVar18 = 0xaf0;
  do {
    mpp_put_bits(&local_190,(long)*(int *)(pbVar7 + lVar18),2);
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0xc70);
  lVar18 = 0x798;
  do {
    mpp_put_bits(&local_190,(ulong)*(uint *)(pbVar7 + lVar18 + -0x18),8);
    mpp_put_bits(&local_190,(ulong)*(uint *)(pbVar7 + lVar18 + -0x14),8);
    mpp_put_bits(&local_190,(ulong)*(uint *)(pbVar7 + lVar18 + -0x10),8);
    mpp_put_bits(&local_190,(ulong)*(uint *)(pbVar7 + lVar18 + -0xc),8);
    mpp_put_bits(&local_190,(ulong)*(uint *)(pbVar7 + lVar18 + -8),8);
    mpp_put_bits(&local_190,(ulong)*(uint *)(pbVar7 + lVar18 + -4),8);
    mpp_put_bits(&local_190,(ulong)*(uint *)(pbVar7 + lVar18),8);
    lVar18 = lVar18 + 0x6c;
  } while (lVar18 != 0xaf8);
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = (MppBuffer)0x0;
  uStack_c0 = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  lVar18 = 0x1ce;
  do {
    uVar23 = (ulong)*(uint *)(pbVar7 + lVar18 * 4);
    *(undefined4 *)((long)&local_c8 + uVar23 * 4) = *(undefined4 *)(pbVar7 + uVar23 * 0x30 + 0xae0);
    local_58[uVar23] = *(uint *)(pbVar7 + uVar23 * 0x30 + 0xae4);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x1d5);
  lVar18 = 0;
  do {
    if ((pbVar7[0x17] & 2) == 0) {
      uVar26 = *(uint *)((long)&local_c8 + lVar18 * 4);
      uVar29 = local_58[lVar18];
    }
    else {
      uVar26 = (uint)*(ushort *)(pbVar7 + 2);
      uVar29 = (uint)*(ushort *)(pbVar7 + 4);
    }
    uVar3 = *(ushort *)(pbVar7 + 4);
    mpp_put_bits(&local_190,
                 (ulong)((uint)(*(ushort *)(pbVar7 + 2) >> 1) + uVar26 * 0x4000) /
                 (ulong)*(ushort *)(pbVar7 + 2),0x10);
    mpp_put_bits(&local_190,(ulong)((uint)(uVar3 >> 1) + uVar29 * 0x4000) / (ulong)uVar3,0x10);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 8);
  mpp_put_bits(&local_190,(ulong)(*(ushort *)(pbVar7 + 0x12) + 7 >> 3),10);
  mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + 0x1c),7);
  mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + 0x1e),7);
  mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + 0x20),0xc);
  mpp_put_bits(&local_190,(ulong)pbVar7[0x524] + 1,3);
  mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + 0x1e) * (ulong)*(ushort *)(pbVar7 + 0x1c),0xd)
  ;
  mpp_put_bits(&local_190,(ulong)pbVar7[0xc99] + (ulong)pbVar7[0xc98],0xc);
  lVar18 = 0x11;
  do {
    mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + lVar18 * 2),7);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x51);
  lVar18 = 0x51;
  do {
    mpp_put_bits(&local_190,(ulong)*(ushort *)(pbVar7 + lVar18 * 2),10);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x91);
  mpp_put_align(&local_190,0x80,0);
  puVar11 = local_160;
  memcpy((void *)local_160[10],(RK_U64 *)((long)puVar20 + 0x1e9d4),0x290);
  pHVar38 = local_158;
  pvVar10 = local_168;
  *(undefined4 *)((long)local_168 + 0xf4) = 0x29;
  *(undefined4 *)((long)local_168 + 0x6c) = *(undefined4 *)(puVar11 + 9);
  sVar19 = mpp_packet_get_length((local_158->dec).input_packet);
  pvVar8 = local_170;
  *(int *)((long)local_170 + 0x10) = (int)sVar19;
  *(uint *)((long)pvVar10 + 0xf0) = (int)sVar19 + 0x8eU & 0xffffff80;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)local_170 + 0x28),(pHVar38->dec).input,SLOT_BUFFER,&local_60);
  iVar13 = mpp_buffer_get_fd_with_caller(local_60,"vdpu383_av1d_gen_regs");
  *(int *)((long)pvVar10 + 0x60) = iVar13;
  uVar26 = *(uint *)(puVar11 + 1);
  *(uint *)((long)pvVar10 + 0xec) = uVar26 * 8 & 0x78;
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar8 + 0x48),0x80,uVar26 & 0xfffffff0);
  iVar13 = mpp_buffer_get_fd_with_caller(local_60,"vdpu383_av1d_gen_regs");
  *(int *)((long)pvVar10 + 0x198) = iVar13;
  lVar18 = *(long *)((long)pvVar8 + 0x50);
  local_148 = (uint *)CONCAT44(local_148._4_4_,*(undefined4 *)((long)pvVar8 + 0x58));
  uVar3 = *(ushort *)(pbVar7 + 2);
  uVar29 = ((uVar3 + 7 >> 3) * 100 + 7 >> 3) + 0x3f & 0x1fffffc0;
  *(undefined4 *)(lVar18 + 100) = 0x8c;
  *(undefined8 *)(lVar18 + 0x6c) = 0x8e00000000;
  *(uint *)(lVar18 + 0x68) = uVar29;
  *(uint *)(lVar18 + 0x78) = uVar29;
  *(uint *)(lVar18 + 0x74) = uVar29;
  uVar26 = (uVar3 + 0x3f >> 6) * 0x158 + 0x3f & 0xffffffc0;
  *(undefined4 *)(lVar18 + 0x7c) = 0x90;
  *(uint *)(lVar18 + 0x84) = uVar29 * 2;
  *(uint *)(lVar18 + 0x80) = uVar26;
  iVar13 = uVar26 + uVar29 * 2;
  *(undefined4 *)(lVar18 + 0x88) = 0x92;
  *(int *)(lVar18 + 0x90) = iVar13;
  *(uint *)(lVar18 + 0x8c) = uVar26;
  iVar13 = uVar26 + iVar13;
  uVar26 = (uVar3 + 0x1ff & 0x1fe00) * 0x24 >> 3;
  *(undefined4 *)(lVar18 + 0x94) = 0x94;
  *(int *)(lVar18 + 0x9c) = iVar13;
  *(uint *)(lVar18 + 0x98) = uVar26;
  iVar13 = iVar13 + uVar26;
  *(undefined4 *)(lVar18 + 0xa0) = 0x96;
  *(int *)(lVar18 + 0xa8) = iVar13;
  *(uint *)(lVar18 + 0xa4) = uVar26;
  iVar13 = iVar13 + uVar26;
  uVar26 = uVar3 + 0x3f & 0xffffffc0;
  iVar17 = uVar26 * 0x44;
  *(undefined4 *)(lVar18 + 0xac) = 0x98;
  *(int *)(lVar18 + 0xb4) = iVar13;
  *(int *)(lVar18 + 0xb0) = iVar17;
  iVar13 = iVar13 + iVar17;
  *(undefined4 *)(lVar18 + 0xb8) = 0x9a;
  *(int *)(lVar18 + 0xc0) = iVar13;
  *(int *)(lVar18 + 0xbc) = iVar17;
  iVar13 = iVar13 + iVar17;
  *(undefined4 *)(lVar18 + 0xc4) = 0x9c;
  *(int *)(lVar18 + 0xcc) = iVar13;
  *(int *)(lVar18 + 200) = iVar17;
  iVar13 = iVar13 + iVar17;
  uVar29 = (uVar26 * 0x7d6 >> 3) + 0x3f & 0xffffffc0;
  *(undefined4 *)(lVar18 + 0xd0) = 0x9e;
  *(int *)(lVar18 + 0xd8) = iVar13;
  *(uint *)(lVar18 + 0xd4) = uVar29;
  iVar13 = uVar29 + iVar13;
  uVar26 = (uVar26 * 0xdc >> 3) + 0x3f & 0xffffffc0;
  *(undefined4 *)(lVar18 + 0xdc) = 0xa0;
  *(int *)(lVar18 + 0xe4) = iVar13;
  *(uint *)(lVar18 + 0xe0) = uVar26;
  *(uint *)(lVar18 + 0xe8) = uVar26 + iVar13;
  uVar4 = *(ushort *)(pbVar7 + 4);
  local_150 = (uint *)(ulong)uVar4;
  uVar5 = *(ushort *)(pbVar7 + 0x1e);
  uVar6 = *(ushort *)(pbVar7 + 0x1c);
  uVar29 = (uint)((*(ulong *)(pbVar7 + 0x14) & 0x1000) == 0) << 6 | 0xffffff80;
  iVar13 = (uint)uVar5 * 0x200;
  uVar30 = ((uint)*(ulong *)(pbVar7 + 0x14) & 0x1000) >> 6;
  uVar31 = uVar30 + uVar3 + 0x3f & uVar29;
  uVar3 = *(ushort *)(pbVar7 + 0xe);
  *(uint *)(lVar18 + 0x68) = ((uVar31 >> 3) * 100 >> 3) + 0x3f & 0x1fffffc0;
  *(undefined4 *)(lVar18 + 0x74) = 0;
  *(uint *)(lVar18 + 0x80) = (uVar31 >> 6) * 0x158 + 0x3f & 0x1fffc0;
  uVar26 = 0;
  if (1 < uVar5) {
    uVar26 = ((uVar31 >> 6) * 0xac0 + iVar13 >> 3) + 0x3f & 0x1fffffc0;
  }
  uVar33 = ((uint)uVar3 + (uint)uVar3 * 2 + 6) * (uVar31 + 0x1ff & 0x3fe00);
  uVar32 = ((uint)uVar3 << 5 | 10) * uVar31;
  uVar27 = (uVar32 >> 4) + 0x3f & 0xffffffc0;
  iVar17 = uVar27 + 0x6c00;
  if (uVar31 < 0x1001) {
    iVar17 = uVar27 + 0x2000;
  }
  uVar27 = (uVar32 + iVar13 >> 3) + 0x3f & 0xffffffc0;
  *(uint *)(lVar18 + 0x8c) = uVar26;
  uVar31 = 0;
  uVar26 = uVar33 + iVar13 >> 3;
  if (uVar5 < 2) {
    uVar26 = 0;
  }
  *(uint *)(lVar18 + 0x98) = uVar33 >> 3;
  *(uint *)(lVar18 + 0xa4) = uVar26;
  *(int *)(lVar18 + 0xb0) = iVar17;
  *(int *)(lVar18 + 0xbc) = iVar17;
  if (uVar5 < 2) {
    uVar27 = 0;
  }
  *(uint *)(lVar18 + 200) = uVar27;
  if (1 < uVar6) {
    uVar31 = (((uint)uVar3 * 0x65 + 0x20) * (uVar4 + uVar30 + 0x3f & uVar29) + (uint)uVar6 * 0x200
             >> 3) + 0x3f & 0xffffffc0;
  }
  local_d8 = (void *)((long)local_168 + 0xe8);
  *(uint *)(lVar18 + 0xd4) = uVar31;
  uVar23 = 0;
  do {
    local_190._0_8_ = *(undefined8 *)(lVar18 + 0xf0 + uVar23 * 8);
    if ((MppBuffer)local_190._0_8_ != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller((MppBuffer)local_190._0_8_,"vdpu383_av1d_rcb_setup");
      *(undefined8 *)(lVar18 + 0xf0 + uVar23 * 8) = 0;
    }
    mpp_buffer_get_with_tag
              (*(MppBufferGroup *)((long)local_170 + 0x38),(MppBuffer *)&local_190,
               (ulong)*(uint *)(lVar18 + 0xe8),"hal_av1d_vdpu383","vdpu383_av1d_rcb_setup");
    pvVar8 = local_170;
    *(undefined8 *)(lVar18 + 0xf0 + uVar23 * 8) = local_190._0_8_;
  } while (((int)local_148 != 0) && (bVar39 = uVar23 < 2, uVar23 = uVar23 + 1, bVar39));
  puVar20 = local_160 + 0x1e;
  if (*(int *)((long)local_170 + 0x58) != 0) {
    puVar20 = puVar20 + (local_158->dec).reg_index;
  }
  plVar9 = *(long **)((long)local_170 + 0x50);
  lVar18 = *plVar9;
  iVar13 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar20,"vdpu383_av1d_rcb_reg_cfg");
  *(int *)(lVar18 + 0x90) = iVar13;
  *(int *)(lVar18 + 0x98) = iVar13;
  *(int *)(lVar18 + 0xa0) = iVar13;
  *(int *)(lVar18 + 0xa8) = iVar13;
  *(int *)(lVar18 + 0xb0) = iVar13;
  *(int *)(lVar18 + 0xb8) = iVar13;
  *(int *)(lVar18 + 0xc0) = iVar13;
  *(int *)(lVar18 + 200) = iVar13;
  *(int *)(lVar18 + 0xd0) = iVar13;
  *(int *)(lVar18 + 0xd8) = iVar13;
  *(int *)(lVar18 + 0xe0) = iVar13;
  *(int *)(lVar18 + 0x94) = (int)plVar9[0xd];
  *(undefined4 *)(lVar18 + 0x9c) = *(undefined4 *)((long)plVar9 + 0x74);
  *(int *)(lVar18 + 0xa4) = (int)plVar9[0x10];
  *(undefined4 *)(lVar18 + 0xac) = *(undefined4 *)((long)plVar9 + 0x8c);
  *(int *)(lVar18 + 0xb4) = (int)plVar9[0x13];
  *(undefined4 *)(lVar18 + 0xbc) = *(undefined4 *)((long)plVar9 + 0xa4);
  *(int *)(lVar18 + 0xc4) = (int)plVar9[0x16];
  *(undefined4 *)(lVar18 + 0xcc) = *(undefined4 *)((long)plVar9 + 0xbc);
  *(int *)(lVar18 + 0xd4) = (int)plVar9[0x19];
  *(undefined4 *)(lVar18 + 0xdc) = *(undefined4 *)((long)plVar9 + 0xd4);
  *(int *)(lVar18 + 0xe4) = (int)plVar9[0x1c];
  lVar18 = 0x6c;
  do {
    mpp_dev_set_reg_offset
              (*(MppDev *)((long)pvVar8 + 0x48),*(RK_S32 *)((long)plVar9 + lVar18 + -8),
               *(RK_U32 *)((long)plVar9 + lVar18));
    lVar18 = lVar18 + 0xc;
  } while (lVar18 != 0xf0);
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)pvVar8 + 0x20),*pbVar7 & 0x7f,SLOT_FRAME_PTR,&local_198);
  pvVar8 = local_168;
  if (local_198 != (MppFrame)0x0) {
    RVar12 = mpp_frame_get_hor_stride(local_198);
    RVar14 = mpp_frame_get_ver_stride(local_198);
    MVar15 = mpp_frame_get_fmt(local_198);
    if ((MVar15 & 0xf00000) == MPP_FMT_YUV420SP) {
      uVar26 = RVar14 * RVar12;
      MVar15 = mpp_frame_get_fmt(local_198);
      if ((MVar15 >> 0x19 & 1) == 0) {
        *(uint *)((long)pvVar8 + 8) = *(uint *)((long)pvVar8 + 8) & 0xfffffffe;
        *(RK_U32 *)((long)pvVar8 + 0xf8) = RVar12 >> 4;
        *(RK_U32 *)((long)pvVar8 + 0xfc) = RVar12 >> 4;
        uVar26 = uVar26 >> 4;
        lVar18 = 0x100;
      }
      else {
        *(uint *)((long)pvVar8 + 8) = *(uint *)((long)pvVar8 + 8) | 2;
        *(RK_U32 *)((long)pvVar8 + 0xf8) = RVar12 * 6 + 0xf >> 4;
        uVar26 = (uVar26 >> 1) + uVar26 >> 4;
        lVar18 = 0x100;
      }
    }
    else {
      RVar12 = mpp_frame_get_fbc_hdr_stride(local_198);
      RVar14 = mpp_frame_get_height(local_198);
      *(byte *)((long)pvVar8 + 8) = *(byte *)((long)pvVar8 + 8) | 1;
      *(RK_U32 *)((long)pvVar8 + 0xf8) = RVar12 >> 6;
      uVar26 = (RVar12 >> 6) * (RVar14 + 0x3f & 0x3fffffc0) * 4;
      lVar18 = 0x1f8;
    }
    *(uint *)((long)pvVar8 + lVar18) = uVar26;
    *(undefined4 *)((long)pvVar8 + 0x128) = *(undefined4 *)((long)pvVar8 + 0xf8);
    *(undefined8 *)((long)pvVar8 + 300) = *(undefined8 *)((long)pvVar8 + 0xfc);
  }
  local_e0 = (uint *)((long)pvVar8 + 0x188);
  local_e8 = (uint *)((long)pvVar8 + 0x17c);
  local_f0 = (uint *)((long)pvVar8 + 0x170);
  local_f8 = (uint *)((long)pvVar8 + 0x164);
  local_100 = (uint *)((long)pvVar8 + 0x158);
  local_108 = (uint *)((long)pvVar8 + 0x14c);
  local_110 = (uint *)((long)pvVar8 + 0x140);
  local_118 = (uint *)((long)pvVar8 + 0x18c);
  local_120 = (uint *)((long)pvVar8 + 0x180);
  local_128 = (uint *)((long)pvVar8 + 0x174);
  local_130 = (uint *)((long)pvVar8 + 0x168);
  local_138 = (uint *)((long)pvVar8 + 0x15c);
  local_68 = (uint *)((long)pvVar8 + 0x150);
  local_70 = (uint *)((long)pvVar8 + 0x144);
  local_148 = (uint *)((long)pvVar8 + 0x138);
  local_80 = (uint *)((long)pvVar8 + 400);
  local_88 = (uint *)((long)pvVar8 + 0x184);
  local_90 = (uint *)((long)pvVar8 + 0x178);
  local_78 = (uint *)((long)pvVar8 + 0x16c);
  local_98 = (uint *)((long)pvVar8 + 0x160);
  local_a0 = (uint *)((long)pvVar8 + 0x154);
  local_a8 = (uint *)((long)pvVar8 + 0x148);
  local_150 = (uint *)((long)pvVar8 + 0x13c);
  lVar18 = 0x1ce;
  do {
    uVar26 = *(uint *)(pbVar7 + lVar18 * 4);
    if (((local_140[(ulong)uVar26 * 0x6c + 0x30] | 0x80) != 0xff) &&
       (mpp_buf_slot_get_prop
                  (*(MppBufSlots *)((long)local_170 + 0x20),
                   (int)(char)local_140[(ulong)uVar26 * 0x6c + 0x30],SLOT_FRAME_PTR,&local_198),
       local_198 != (MppFrame)0x0)) {
      RVar12 = mpp_frame_get_hor_stride(local_198);
      RVar14 = mpp_frame_get_ver_stride(local_198);
      uVar29 = RVar14 * RVar12;
      MVar15 = mpp_frame_get_fmt(local_198);
      if ((MVar15 & 0xf00000) == MPP_FMT_YUV420SP) {
        MVar15 = mpp_frame_get_fmt(local_198);
        if ((MVar15 >> 0x19 & 1) != 0) {
          RVar12 = RVar12 * 6 + 0xf;
          uVar29 = uVar29 + (uVar29 >> 1);
        }
      }
      else {
        RVar12 = mpp_frame_get_fbc_hdr_stride(local_198);
        RVar12 = RVar12 >> 2;
      }
      puVar21 = (uint *)((long)pvVar8 + 0x134);
      switch(uVar26) {
      case 0:
        break;
      case 1:
        puVar21 = local_110;
        break;
      case 2:
        puVar21 = local_108;
        break;
      case 3:
        puVar21 = local_100;
        break;
      case 4:
        puVar21 = local_f8;
        break;
      case 5:
        puVar21 = local_f0;
        break;
      case 6:
        puVar21 = local_e8;
        break;
      case 7:
        puVar21 = local_e0;
        break;
      default:
        goto switchD_002178e1_default;
      }
      *puVar21 = RVar12 >> 4;
      puVar21 = local_148;
      switch(uVar26) {
      case 0:
        break;
      case 1:
        puVar21 = local_70;
        break;
      case 2:
        puVar21 = local_68;
        break;
      case 3:
        puVar21 = local_138;
        break;
      case 4:
        puVar21 = local_130;
        break;
      case 5:
        puVar21 = local_128;
        break;
      case 6:
        puVar21 = local_120;
        break;
      case 7:
        puVar21 = local_118;
        break;
      default:
        goto switchD_002178e1_default;
      }
      *puVar21 = RVar12 >> 4;
      puVar21 = local_150;
      switch(uVar26) {
      case 0:
        break;
      case 1:
        puVar21 = local_a8;
        break;
      case 2:
        puVar21 = local_a0;
        break;
      case 3:
        puVar21 = local_98;
        break;
      case 4:
        puVar21 = local_78;
        break;
      case 5:
        puVar21 = local_90;
        break;
      case 6:
        puVar21 = local_88;
        break;
      case 7:
        puVar21 = local_80;
        break;
      default:
        goto switchD_002178e1_default;
      }
      *puVar21 = uVar29 >> 4;
    }
switchD_002178e1_default:
    pHVar38 = local_158;
    pvVar10 = local_170;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x1d5);
  local_c8 = (MppBuffer)0x0;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)local_170 + 0x20),(local_158->dec).output,SLOT_FRAME_PTR,
             &local_198);
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)pvVar10 + 0x20),(pHVar38->dec).output,SLOT_BUFFER,&local_c8);
  iVar13 = mpp_buffer_get_fd_with_caller(local_c8,"vdpu383_av1d_gen_regs");
  pvVar8 = local_168;
  *(int *)((long)local_168 + 0x194) = iVar13;
  iVar13 = mpp_buffer_get_fd_with_caller(local_c8,"vdpu383_av1d_gen_regs");
  *(int *)((long)pvVar8 + 500) = iVar13;
  local_150 = (uint *)((long)pvVar8 + 0x1b8);
  local_158 = (HalTaskInfo *)((long)pvVar8 + 0x1b4);
  local_e0 = (uint *)((long)pvVar8 + 0x1b0);
  local_e8 = (uint *)((long)pvVar8 + 0x1ac);
  local_f0 = (uint *)((long)pvVar8 + 0x1a8);
  local_f8 = (uint *)((long)pvVar8 + 0x1a4);
  local_100 = (uint *)((long)pvVar8 + 0x1a0);
  local_108 = (uint *)((long)pvVar8 + 0x21c);
  local_110 = (uint *)((long)pvVar8 + 0x218);
  local_118 = (uint *)((long)pvVar8 + 0x214);
  local_120 = (uint *)((long)pvVar8 + 0x210);
  local_128 = (uint *)((long)pvVar8 + 0x20c);
  local_130 = (uint *)((long)pvVar8 + 0x208);
  local_138 = (uint *)((long)pvVar8 + 0x204);
  local_148 = (uint *)((long)pvVar8 + 0x200);
  lVar18 = 0x1ce;
  do {
    uVar26 = *(uint *)(pbVar7 + lVar18 * 4);
    if ((local_140[(ulong)uVar26 * 0x6c + 0x30] | 0x80) != 0xff) {
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)((long)local_170 + 0x20),
                 (int)(char)local_140[(ulong)uVar26 * 0x6c + 0x30],SLOT_BUFFER,&local_c8);
      if ((local_160[0x3d8d] != 0) && (RVar12 = mpp_frame_get_thumbnail_en(local_198), RVar12 == 2))
      {
        pHVar22 = hal_bufs_get_buf((HalBufs)local_160[0x3d8d],
                                   (int)(char)local_140[(ulong)uVar26 * 0x6c + 0x30]);
        local_c8 = *pHVar22->buf;
      }
      if (local_c8 != (MppBuffer)0x0) {
        pHVar38 = (HalTaskInfo *)((long)pvVar8 + 0x19c);
        switch(uVar26) {
        case 0:
          break;
        case 1:
          pHVar38 = (HalTaskInfo *)local_100;
          break;
        case 2:
          pHVar38 = (HalTaskInfo *)local_f8;
          break;
        case 3:
          pHVar38 = (HalTaskInfo *)local_f0;
          break;
        case 4:
          pHVar38 = (HalTaskInfo *)local_e8;
          break;
        case 5:
          pHVar38 = (HalTaskInfo *)local_e0;
          break;
        case 6:
          pHVar38 = local_158;
          break;
        case 7:
          pHVar38 = (HalTaskInfo *)local_150;
          break;
        default:
          goto switchD_00217c13_default;
        }
        iVar13 = mpp_buffer_get_fd_with_caller(local_c8,"vdpu383_av1d_gen_regs");
        *(int *)&pHVar38->dec = iVar13;
        puVar21 = local_148;
        switch(uVar26) {
        case 0:
          break;
        case 1:
          puVar21 = local_138;
          break;
        case 2:
          puVar21 = local_130;
          break;
        case 3:
          puVar21 = local_128;
          break;
        case 4:
          puVar21 = local_120;
          break;
        case 5:
          puVar21 = local_118;
          break;
        case 6:
          puVar21 = local_110;
          break;
        case 7:
          puVar21 = local_108;
          break;
        default:
          goto switchD_00217c13_default;
        }
        iVar13 = mpp_buffer_get_fd_with_caller(local_c8,"vdpu383_av1d_gen_regs");
        *puVar21 = iVar13;
      }
    }
switchD_00217c13_default:
    puVar20 = local_160;
    pvVar10 = local_170;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x1d5);
  lVar18 = *(long *)((long)local_170 + 0x50);
  uVar26 = (*(ushort *)(pbVar7 + 2) + 0x3f >> 2 & 0xfffffff0) *
           (*(ushort *)(pbVar7 + 4) + 0x3f & 0xffffffc0);
  local_190._0_8_ = ZEXT48(uVar26);
  ppvVar34 = (HalBufs *)(lVar18 + 0x108);
  if (*(HalBufs *)(lVar18 + 0x108) != (HalBufs)0x0) {
    if (uVar26 <= *(uint *)(lVar18 + 0x114)) goto LAB_00217d91;
    hal_bufs_deinit(*(HalBufs *)(lVar18 + 0x108));
    *ppvVar34 = (HalBufs)0x0;
  }
  hal_bufs_init(ppvVar34);
  if (*ppvVar34 == (HalBufs)0x0) {
    _mpp_log_l(2,"hal_av1d_vdpu383","colmv bufs init fail","vdpu383_av1d_colmv_setup");
  }
  else {
    *(RK_U32 *)(lVar18 + 0x114) = local_190.buflen;
    RVar16 = mpp_buf_slot_get_count(*(MppBufSlots *)((long)pvVar10 + 0x20));
    *(RK_S32 *)(lVar18 + 0x110) = RVar16;
    hal_bufs_setup(*(HalBufs *)(lVar18 + 0x108),RVar16,1,(size_t *)&local_190);
  }
LAB_00217d91:
  pHVar22 = hal_bufs_get_buf((HalBufs)puVar20[0x21],*pbVar7 & 0x7f);
  iVar13 = mpp_buffer_get_fd_with_caller(*pHVar22->buf,"vdpu383_av1d_gen_regs");
  *(int *)((long)local_168 + 0x254) = iVar13;
  piVar36 = (int *)((long)local_168 + 600);
  lVar18 = 0x1e9;
  do {
    if ((pbVar7[lVar18 * 4] | 0x80) != 0xff) {
      pHVar22 = hal_bufs_get_buf((HalBufs)puVar20[0x21],(int)(char)pbVar7[lVar18 * 4]);
      iVar13 = mpp_buffer_get_fd_with_caller(*pHVar22->buf,"vdpu383_av1d_gen_regs");
      *piVar36 = iVar13;
    }
    piVar36 = piVar36 + 1;
    lVar18 = lVar18 + 0x1b;
  } while (lVar18 != 0x2c1);
  lVar18 = *(long *)((long)pvVar10 + 0x50);
  if (*(long *)(lVar18 + 0x260) == 0) {
    local_190._0_8_ =
         ZEXT48(((uint)*(ushort *)(pbVar7 + 2) * 4 + 0x1fc & 0x7fe00) *
                (*(ushort *)(pbVar7 + 4) + 0x7f >> 7) + 0x73a0);
    hal_bufs_init((HalBufs *)(lVar18 + 0x260));
    if (*(HalBufs *)(lVar18 + 0x260) == (HalBufs)0x0) {
      _mpp_log_l(2,"hal_av1d_vdpu383","cdf bufs init fail","vdpu383_av1d_cdf_setup");
    }
    else {
      *(RK_U32 *)(lVar18 + 0x26c) = local_190.buflen;
      RVar16 = mpp_buf_slot_get_count(*(MppBufSlots *)((long)pvVar10 + 0x20));
      *(RK_S32 *)(lVar18 + 0x268) = RVar16;
      hal_bufs_setup(*(HalBufs *)(lVar18 + 0x260),RVar16,1,(size_t *)&local_190);
    }
  }
  plVar9 = *(long **)((long)pvVar10 + 0x50);
  bVar1 = pbVar7[0x528];
  if (bVar1 == 0) {
    lVar18 = 0;
    do {
      *(undefined4 *)((long)plVar9 + lVar18 + 0x124) = 0;
      lVar18 = lVar18 + 0x28;
    } while (lVar18 != 0x140);
  }
  bVar2 = pbVar7[0x54e];
  iVar13 = 0;
  if ((0x14 < bVar2) && (iVar13 = 1, 0x3c < bVar2)) {
    iVar13 = 3 - (uint)(bVar2 < 0x79);
  }
  lVar18 = *plVar9;
  if ((bVar1 == 0) || ((ulong)pbVar7[0x52e] == 7)) {
    iVar17 = mpp_buffer_get_fd_with_caller((MppBuffer)plVar9[0x4b],"vdpu383_av1d_set_cdf");
    *(int *)(lVar18 + 0x1d4) = iVar17;
    buffer = (MppBuffer)plVar9[0x4b];
    lVar25 = 0x1bc;
  }
  else {
    uVar23 = (ulong)*(uint *)(pbVar7 + (ulong)pbVar7[0x52e] * 4 + 0x738);
    iVar13 = (int)plVar9[uVar23 * 5 + 0x25];
    if (((pbVar7[0x17] & 0x20) == 0) && (*(int *)((long)plVar9 + uVar23 * 0x28 + 0x124) != 0)) {
      pHVar22 = hal_bufs_get_buf((HalBufs)plVar9[0x4c],(int)(char)local_140[uVar23 * 0x6c + 0x30]);
      ppvVar24 = pHVar22->buf;
    }
    else {
      ppvVar24 = (MppBuffer *)(plVar9 + 0x4b);
    }
    buffer = *ppvVar24;
    iVar17 = mpp_buffer_get_fd_with_caller(buffer,"vdpu383_av1d_set_cdf");
    *(int *)(lVar18 + 0x1d4) = iVar17;
    iVar17 = mpp_buffer_get_fd_with_caller(buffer,"vdpu383_av1d_set_cdf");
    *(int *)(lVar18 + 0x1bc) = iVar17;
    lVar25 = 0x1c8;
  }
  iVar17 = mpp_buffer_get_fd_with_caller(buffer,"vdpu383_av1d_set_cdf");
  *(int *)(lVar18 + lVar25) = iVar17;
  pHVar22 = hal_bufs_get_buf((HalBufs)plVar9[0x4c],*pbVar7 & 0x7f);
  iVar17 = mpp_buffer_get_fd_with_caller(*pHVar22->buf,"vdpu383_av1d_set_cdf");
  *(int *)(lVar18 + 0x1d8) = iVar17;
  iVar17 = mpp_buffer_get_fd_with_caller(*pHVar22->buf,"vdpu383_av1d_set_cdf");
  *(int *)(lVar18 + 0x1c0) = iVar17;
  iVar17 = mpp_buffer_get_fd_with_caller(*pHVar22->buf,"vdpu383_av1d_set_cdf");
  pvVar8 = local_170;
  *(int *)(lVar18 + 0x1cc) = iVar17;
  mpp_dev_set_reg_offset(*(MppDev *)((long)local_170 + 0x48),0xb2,iVar13 * 0x1620 + 0x1b20);
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar8 + 0x48),0xb3,0x1b20);
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar8 + 0x48),0xb5,0x73a0);
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar8 + 0x48),0xb6,0x73a0);
  bVar1 = pbVar7[0xc86];
  plVar37 = plVar9 + 0x25;
  lVar18 = 0;
  do {
    if ((bVar1 >> ((uint)lVar18 & 0x1f) & 1) != 0) {
      if ((pbVar7[0x17] & 0x20) == 0) {
        *(undefined8 *)((long)plVar37 + -4) = 1;
      }
      else if ((*(int *)(pbVar7 + 0xc78) == 0) || (pbVar7[0x528] != 0)) {
        *(int *)plVar37 = iVar13;
      }
      else {
        *(int *)plVar37 = (int)plVar9[(ulong)*(uint *)(pbVar7 + 0xc74) * 5 + 0x25];
      }
    }
    lVar18 = lVar18 + 1;
    plVar37 = plVar37 + 5;
  } while (lVar18 != 8);
  mpp_buffer_sync_end_f((MppBuffer)local_160[8],0,"vdpu383_av1d_gen_regs");
  local_190._0_8_ = (MppBuffer)0x0;
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)pvVar8 + 0x20),*pbVar7 & 0x7f,SLOT_BUFFER,&local_190)
  ;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)pvVar8 + 0x20),*pbVar7 & 0x7f,SLOT_FRAME_PTR,&local_198);
  RVar12 = mpp_frame_get_thumbnail_en(local_198);
  iVar13 = mpp_buffer_get_fd_with_caller((MppBuffer)local_190._0_8_,"vdpu383_av1d_gen_regs");
  pvVar8 = local_168;
  if (RVar12 == 1) {
    *(int *)((long)local_168 + 0x74) = iVar13;
  }
  else {
    if (RVar12 != 2) {
      *(byte *)((long)local_168 + 8) = *(byte *)((long)local_168 + 8) & 0xdf;
      return MPP_OK;
    }
    *(int *)((long)local_168 + 0x74) = iVar13;
    pHVar22 = hal_bufs_get_buf((HalBufs)local_160[0x3d8d],*pbVar7 & 0x7f);
    iVar13 = mpp_buffer_get_fd_with_caller(*pHVar22->buf,"vdpu383_av1d_gen_regs");
    *(int *)((long)pvVar8 + 0x194) = iVar13;
    *(int *)((long)pvVar8 + 500) = iVar13;
    *(int *)((long)pvVar8 + 0x198) = iVar13;
  }
  vdpu383_setup_down_scale(local_198,*(MppDev *)((long)local_170 + 0x48),local_d0,local_d8);
  return MPP_OK;
}

Assistant:

MPP_RET vdpu383_av1d_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    Vdpu383Av1dRegCtx *ctx = (Vdpu383Av1dRegCtx *)p_hal->reg_ctx;
    Vdpu383Av1dRegSet *regs;
    DXVA_PicParams_AV1 *dxva = (DXVA_PicParams_AV1*)task->dec.syntax.data;
    RK_U32 i = 0;
    HalBuf *origin_buf = NULL;
    MppFrame mframe;

    INP_CHECK(ret, NULL == p_hal);

    ctx->refresh_frame_flags = dxva->refresh_frame_flags;

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        mpp_err_f("parse err %d ref err %d\n",
                  task->dec.flags.parse_err, task->dec.flags.ref_err);
        goto __RETURN;
    }

    mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_FRAME_PTR, &mframe);
    if (mpp_frame_get_thumbnail_en(mframe) == MPP_FRAME_THUMBNAIL_ONLY &&
        MPP_MAX(dxva->width, dxva->height) > 4096 && ctx->origin_bufs == NULL) {
        vdpu383_setup_scale_origin_bufs(p_hal, mframe);
    }

    if (p_hal->fast_mode) {
        for (i = 0; i <  MPP_ARRAY_ELEMS(ctx->reg_buf); i++) {
            if (!ctx->reg_buf[i].valid) {
                task->dec.reg_index = i;
                ctx->regs = ctx->reg_buf[i].regs;
                ctx->reg_buf[i].valid = 1;
                ctx->offset_uncomps = ctx->uncmps_offset[i];
                break;
            }
        }
    }
    regs = ctx->regs;
    memset(regs, 0, sizeof(*regs));
    p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);

#ifdef DUMP_AV1D_VDPU383_DATAS
    {
        memset(dump_cur_dir, 0, sizeof(dump_cur_dir));
        sprintf(dump_cur_dir, "av1/Frame%04d", dump_cur_frame);
        if (access(dump_cur_dir, 0)) {
            if (mkdir(dump_cur_dir))
                mpp_err_f("error: mkdir %s\n", dump_cur_dir);
        }
        dump_cur_frame++;
    }
#endif

    /* set reg -> ctrl reg */
    {
        regs->ctrl_regs.reg8_dec_mode          = 4; // av1
        regs->ctrl_regs.reg9.fbc_e             = 0;
        regs->ctrl_regs.reg9.buf_empty_en      = 0;

        regs->ctrl_regs.reg10.strmd_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.inter_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.intra_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.transd_auto_gating_e   = 1;
        regs->ctrl_regs.reg10.recon_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.filterd_auto_gating_e  = 1;
        regs->ctrl_regs.reg10.bus_auto_gating_e      = 1;
        regs->ctrl_regs.reg10.ctrl_auto_gating_e     = 1;
        regs->ctrl_regs.reg10.rcb_auto_gating_e      = 1;
        regs->ctrl_regs.reg10.err_prc_auto_gating_e  = 1;

        // regs->ctrl_regs.reg11.dec_timeout_dis        = 1;

        regs->ctrl_regs.reg13_core_timeout_threshold  = 0x3fffff;

        regs->ctrl_regs.reg16.error_proc_disable     = 1;
        regs->ctrl_regs.reg16.error_spread_disable   = 0;
        regs->ctrl_regs.reg16.roi_error_ctu_cal_en   = 0;

        regs->ctrl_regs.reg20_cabac_error_en_lowbits  = 0xffffffdf;
        regs->ctrl_regs.reg21_cabac_error_en_highbits = 0x3fffffff;

        regs->ctrl_regs.reg28.axi_perf_work_e = 1;
        regs->ctrl_regs.reg28.axi_cnt_type    = 1;
        regs->ctrl_regs.reg28.rd_latency_id   = 11;

        regs->ctrl_regs.reg29.addr_align_type     = 1;
        regs->ctrl_regs.reg29.ar_cnt_id_type      = 0;
        regs->ctrl_regs.reg29.aw_cnt_id_type      = 1;
        regs->ctrl_regs.reg29.ar_count_id         = 17;
        regs->ctrl_regs.reg29.aw_count_id         = 0;
        regs->ctrl_regs.reg29.rd_band_width_mode  = 0;

        regs->ctrl_regs.reg30.axi_wr_qos = 0;
        regs->ctrl_regs.reg30.axi_rd_qos = 0;
    }

    /* set reg -> pkt data */
    {
        MppBuffer mbuffer = NULL;

        /* uncompress header data */
        prepare_uncompress_header(p_hal, dxva, (RK_U64 *)ctx->header_data, sizeof(ctx->header_data) / 8);
        memcpy((char *)ctx->bufs_ptr, (void *)ctx->header_data, sizeof(ctx->header_data));
        regs->av1d_paras.reg67_global_len = VDPU383_UNCMPS_HEADER_SIZE / 16; // 128 bit as unit
        regs->common_addr.reg131_gbl_base = ctx->bufs_fd;
        // mpp_dev_set_reg_offset(p_hal->dev, 131, ctx->offset_uncomps);
#ifdef DUMP_AV1D_VDPU383_DATAS
        {
            char *cur_fname = "global_cfg.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, ctx->bufs_ptr,
                              8 * regs->av1d_paras.reg67_global_len * 16, 64, 0, 0);
        }
#endif
        // input strm
        p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);
        regs->av1d_paras.reg66_stream_len = MPP_ALIGN(p_hal->strm_len + 15, 128);
        mpp_buf_slot_get_prop(p_hal->packet_slots, task->dec.input, SLOT_BUFFER, &mbuffer);
        regs->common_addr.reg128_strm_base = mpp_buffer_get_fd(mbuffer);
        regs->av1d_paras.reg65_strm_start_bit = (ctx->offset_uncomps & 0xf) * 8; // bit start to decode
        mpp_dev_set_reg_offset(p_hal->dev, 128, ctx->offset_uncomps & 0xfffffff0);
        /* error */
        regs->av1d_addrs.reg169_error_ref_base = mpp_buffer_get_fd(mbuffer);
#ifdef DUMP_AV1D_VDPU383_DATAS
        {
            char *cur_fname = "stream_in.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mbuffer)
                              + ctx->offset_uncomps,
                              8 * p_hal->strm_len, 128, 0, 0);
        }
        {
            char *cur_fname = "stream_in_no_offset.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mbuffer),
                              8 * p_hal->strm_len, 128, 0, 0);
        }
#endif
    }

    /* set reg -> rcb */
    vdpu383_av1d_rcb_setup(p_hal, dxva);
    vdpu383_av1d_rcb_reg_cfg(p_hal, p_hal->fast_mode ? ctx->rcb_bufs[task->dec.reg_index] : ctx->rcb_bufs[0]);

    /* set reg -> para (stride, len) */
    {
        RK_U32 hor_virstride = 0;
        RK_U32 ver_virstride = 0;
        RK_U32 y_virstride = 0;
        RK_U32 uv_virstride = 0;
        RK_U32 mapped_idx;

        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_FRAME_PTR, &mframe);
        if (mframe) {
            hor_virstride = mpp_frame_get_hor_stride(mframe);
            ver_virstride = mpp_frame_get_ver_stride(mframe);
            y_virstride = hor_virstride * ver_virstride;
            uv_virstride = hor_virstride * ver_virstride / 2;

            if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
                RK_U32 fbd_offset;
                RK_U32 fbc_hdr_stride = mpp_frame_get_fbc_hdr_stride(mframe);
                RK_U32 h = MPP_ALIGN(mpp_frame_get_height(mframe), 64);

                regs->ctrl_regs.reg9.fbc_e = 1;
                regs->av1d_paras.reg68_hor_virstride = fbc_hdr_stride / 64;
                fbd_offset = regs->av1d_paras.reg68_hor_virstride * h * 4;
                regs->av1d_addrs.reg193_fbc_payload_offset = fbd_offset;
            } else if (MPP_FRAME_FMT_IS_TILE(mpp_frame_get_fmt(mframe))) {
                regs->ctrl_regs.reg9.tile_e = 1;
                regs->av1d_paras.reg68_hor_virstride = MPP_ALIGN(hor_virstride * 6, 16) >> 4;
                regs->av1d_paras.reg70_y_virstride = (y_virstride + uv_virstride) >> 4;
            } else {
                regs->ctrl_regs.reg9.fbc_e = 0;
                regs->av1d_paras.reg68_hor_virstride = hor_virstride >> 4;
                regs->av1d_paras.reg69_raster_uv_hor_virstride = hor_virstride >> 4;
                regs->av1d_paras.reg70_y_virstride = y_virstride >> 4;
            }
            /* error */
            regs->av1d_paras.reg80_error_ref_hor_virstride = regs->av1d_paras.reg68_hor_virstride;
            regs->av1d_paras.reg81_error_ref_raster_uv_hor_virstride = regs->av1d_paras.reg69_raster_uv_hor_virstride;
            regs->av1d_paras.reg82_error_ref_virstride = regs->av1d_paras.reg70_y_virstride;
        }

        for (i = 0; i < ALLOWED_REFS_PER_FRAME_EX; ++i) {
            mapped_idx = dxva->ref_frame_idx[i];
            if (dxva->frame_refs[mapped_idx].Index != (CHAR)0xff && dxva->frame_refs[mapped_idx].Index != 0x7f) {
                mpp_buf_slot_get_prop(p_hal->slots, dxva->frame_refs[mapped_idx].Index, SLOT_FRAME_PTR, &mframe);
                if (mframe) {
                    hor_virstride = mpp_frame_get_hor_stride(mframe);
                    ver_virstride = mpp_frame_get_ver_stride(mframe);
                    y_virstride = hor_virstride * ver_virstride;
                    if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
                        hor_virstride = mpp_frame_get_fbc_hdr_stride(mframe) / 4;
                    } else if (MPP_FRAME_FMT_IS_TILE(mpp_frame_get_fmt(mframe))) {
                        hor_virstride = MPP_ALIGN(hor_virstride * 6, 16);
                        y_virstride += y_virstride / 2;
                    }
                    SET_REF_HOR_VIRSTRIDE(regs->av1d_paras, mapped_idx, hor_virstride >> 4);
                    SET_REF_RASTER_UV_HOR_VIRSTRIDE(regs->av1d_paras, mapped_idx, hor_virstride >> 4);
                    SET_REF_VIRSTRIDE(regs->av1d_paras, mapped_idx, y_virstride >> 4);
                }
            }
        }
    }

    /* set reg -> para (ref, fbc, colmv) */
    {
        MppBuffer mbuffer = NULL;
        RK_U32 mapped_idx;
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_BUFFER, &mbuffer);
        regs->av1d_addrs.reg168_decout_base = mpp_buffer_get_fd(mbuffer);
        regs->av1d_addrs.reg192_payload_st_cur_base = mpp_buffer_get_fd(mbuffer);
        // VDPU383_SET_BUF_PROTECT_VAL(mpp_buffer_get_ptr(mbuffer), mpp_buffer_get_size(mbuffer), 0xbb, 128);

        for (i = 0; i < ALLOWED_REFS_PER_FRAME_EX; i++) {
            mapped_idx = dxva->ref_frame_idx[i];
            if (dxva->frame_refs[mapped_idx].Index != (CHAR)0xff && dxva->frame_refs[mapped_idx].Index != 0x7f) {
                mpp_buf_slot_get_prop(p_hal->slots, dxva->frame_refs[mapped_idx].Index, SLOT_BUFFER, &mbuffer);
                if (ctx->origin_bufs && mpp_frame_get_thumbnail_en(mframe) == MPP_FRAME_THUMBNAIL_ONLY) {
                    origin_buf = hal_bufs_get_buf(ctx->origin_bufs, dxva->frame_refs[mapped_idx].Index);
                    mbuffer = origin_buf->buf[0];
                }
                if (mbuffer) {
                    SET_REF_BASE(regs->av1d_addrs, mapped_idx, mpp_buffer_get_fd(mbuffer));
                    SET_FBC_PAYLOAD_REF_BASE(regs->av1d_addrs, mapped_idx, mpp_buffer_get_fd(mbuffer));
                }
            }
        }

        HalBuf *mv_buf = NULL;
        vdpu383_av1d_colmv_setup(p_hal, dxva);
        mv_buf = hal_bufs_get_buf(ctx->colmv_bufs, dxva->CurrPic.Index7Bits);
        regs->av1d_addrs.reg216_colmv_cur_base = mpp_buffer_get_fd(mv_buf->buf[0]);
#ifdef DUMP_AV1D_VDPU383_DATAS
        memset(mpp_buffer_get_ptr(mv_buf->buf[0]), 0, mpp_buffer_get_size(mv_buf->buf[0]));
#endif
        for (i = 0; i < NUM_REF_FRAMES; i++) {
            if (dxva->frame_refs[i].Index != (CHAR)0xff && dxva->frame_refs[i].Index != 0x7f) {
                mv_buf = hal_bufs_get_buf(ctx->colmv_bufs, dxva->frame_refs[i].Index);
                regs->av1d_addrs.reg217_232_colmv_ref_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);
#ifdef DUMP_AV1D_VDPU383_DATAS
                {
                    char *cur_fname = "colmv_ref_frame";
                    memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
                    sprintf(dump_cur_fname_path, "%s/%s%d.dat", dump_cur_dir, cur_fname, i);
                    dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mv_buf->buf[0]),
                                      8 * mpp_buffer_get_size(mv_buf->buf[0]), 64, 0, 0);
                }
#endif
            }
        }
    }

    {
        vdpu383_av1d_cdf_setup(p_hal, dxva);
        vdpu383_av1d_set_cdf(p_hal, dxva);
    }
    mpp_buffer_sync_end(ctx->bufs);

    {
        //scale down config
        MppBuffer mbuffer = NULL;
        RK_S32 fd = -1;
        MppFrameThumbnailMode thumbnail_mode;

        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_BUFFER, &mbuffer);
        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits,
                              SLOT_FRAME_PTR, &mframe);
        thumbnail_mode = mpp_frame_get_thumbnail_en(mframe);
        fd = mpp_buffer_get_fd(mbuffer);

        switch (thumbnail_mode) {
        case MPP_FRAME_THUMBNAIL_ONLY:
            regs->common_addr.reg133_scale_down_base = fd;
            origin_buf = hal_bufs_get_buf(ctx->origin_bufs, dxva->CurrPic.Index7Bits);
            fd = mpp_buffer_get_fd(origin_buf->buf[0]);
            regs->av1d_addrs.reg168_decout_base = fd;
            regs->av1d_addrs.reg192_payload_st_cur_base = fd;
            regs->av1d_addrs.reg169_error_ref_base = fd;
            vdpu383_setup_down_scale(mframe, p_hal->dev, &regs->ctrl_regs,
                                     (void *)&regs->av1d_paras);
            break;
        case MPP_FRAME_THUMBNAIL_MIXED:
            regs->common_addr.reg133_scale_down_base = fd;
            vdpu383_setup_down_scale(mframe, p_hal->dev, &regs->ctrl_regs,
                                     (void *)&regs->av1d_paras);
            break;
        case MPP_FRAME_THUMBNAIL_NONE:
        default:
            regs->ctrl_regs.reg9.scale_down_en = 0;
            break;
        }
    }

__RETURN:
    return ret = MPP_OK;
}